

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqGrNode.h
# Opt level: O0

int __thiscall EqGrNode::get_sup(EqGrNode *this,int idx,int clas)

{
  int iVar1;
  element_type *peVar2;
  __shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3;
  element_type *peVar4;
  int local_28;
  int local_24;
  int i;
  int sum;
  int clas_local;
  int idx_local;
  EqGrNode *this_local;
  
  if (clas == -1) {
    local_24 = 0;
    for (local_28 = 0; local_28 < this->num_class; local_28 = local_28 + 1) {
      peVar2 = std::
               __shared_ptr_access<std::vector<std::shared_ptr<Array>,_std::allocator<std::shared_ptr<Array>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Array>,_std::allocator<std::shared_ptr<Array>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->_set_sup);
      p_Var3 = (__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::vector<std::shared_ptr<Array>,_std::allocator<std::shared_ptr<Array>_>_>::at
                         (peVar2,(long)local_28);
      peVar4 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                         (p_Var3);
      iVar1 = Array::operator[](peVar4,idx);
      local_24 = iVar1 + local_24;
    }
    this_local._4_4_ = local_24;
  }
  else {
    peVar2 = std::
             __shared_ptr_access<std::vector<std::shared_ptr<Array>,_std::allocator<std::shared_ptr<Array>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Array>,_std::allocator<std::shared_ptr<Array>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_set_sup);
    p_Var3 = (__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::vector<std::shared_ptr<Array>,_std::allocator<std::shared_ptr<Array>_>_>::at
                       (peVar2,(long)clas);
    peVar4 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       (p_Var3);
    this_local._4_4_ = Array::operator[](peVar4,idx);
  }
  return this_local._4_4_;
}

Assistant:

int get_sup(int idx, int clas = -1) {
        if (clas == -1) {
            int sum = 0;
            //return sup in all classes
            for (int i = 0; i < num_class; i++)
                sum += (*_set_sup->at(i))[idx];
            return sum;
        } else return (*_set_sup->at(clas))[idx]; //return sup in class only
    }